

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O3

void __thiscall PolynomialFDS::display(PolynomialFDS *this,ostream *o)

{
  pointer pbVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"PolynomialFDS numstates=",0x18);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)o,this->mNumStates);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," numvars=",9);
  plVar3 = (long *)std::ostream::operator<<
                             ((ostream *)poVar2,
                              (int)((ulong)((long)(this->mPolynomials).
                                                  super__Vector_base<Polynomial,_std::allocator<Polynomial>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->mPolynomials).
                                                 super__Vector_base<Polynomial,_std::allocator<Polynomial>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 6));
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if ((this->mPolynomials).super__Vector_base<Polynomial,_std::allocator<Polynomial>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mPolynomials).super__Vector_base<Polynomial,_std::allocator<Polynomial>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = &this->mVariableNames;
    lVar5 = 4;
    lVar4 = 0;
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"  ",2);
      pbVar1 = (this->mVariableNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (o,*(char **)((long)pbVar1 + lVar5 * 2 + -8),
                          *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5 * 2));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      Polynomial::evaluateSymbolic
                (&local_58,
                 (Polynomial *)
                 ((long)&((this->mPolynomials).
                          super__Vector_base<Polynomial,_std::allocator<Polynomial>_>._M_impl.
                          super__Vector_impl_data._M_start)->mNumStates + lVar4),local_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x40;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->mPolynomials).
                                   super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->mPolynomials).
                                   super__Vector_base<Polynomial,_std::allocator<Polynomial>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  return;
}

Assistant:

void PolynomialFDS::display(std::ostream& o)
{
  o << "PolynomialFDS numstates=" << numStates()
    << " numvars=" << numVariables()
    << std::endl;
  for (int i=0; i < mPolynomials.size(); i++)
    o << "  " << mVariableNames[i] << " = " << mPolynomials[i].evaluateSymbolic(mVariableNames) << std::endl;
}